

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void WindowSettingsHandler_ApplyAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  int iVar1;
  ImGuiWindow *window;
  char *pcVar2;
  ImGuiWindowSettings *settings;
  
  pcVar2 = (ctx->SettingsWindows).Buf.Data;
  settings = (ImGuiWindowSettings *)(pcVar2 + 4);
  if (pcVar2 == (char *)0x0) {
    settings = (ImGuiWindowSettings *)0x0;
  }
  while (settings != (ImGuiWindowSettings *)0x0) {
    if (settings->WantApply == true) {
      window = ImGui::FindWindowByID(settings->ID);
      if (window != (ImGuiWindow *)0x0) {
        ApplyWindowSettings(window,settings);
      }
      settings->WantApply = false;
      pcVar2 = (ctx->SettingsWindows).Buf.Data;
    }
    iVar1._0_1_ = settings[-1].Collapsed;
    iVar1._1_1_ = settings[-1].WantApply;
    iVar1._2_2_ = *(undefined2 *)&settings[-1].field_0xe;
    settings = (ImGuiWindowSettings *)((long)&settings->ID + (long)iVar1);
    if (settings == (ImGuiWindowSettings *)(pcVar2 + (long)(ctx->SettingsWindows).Buf.Size + 4)) {
      settings = (ImGuiWindowSettings *)0x0;
    }
  }
  return;
}

Assistant:

static void WindowSettingsHandler_ApplyAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    ImGuiContext& g = *ctx;
    for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
        if (settings->WantApply)
        {
            if (ImGuiWindow* window = ImGui::FindWindowByID(settings->ID))
                ApplyWindowSettings(window, settings);
            settings->WantApply = false;
        }
}